

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

ArrayPtr<const_unsigned_char> * __thiscall
kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
          (Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this,
          ArrayPtr<const_unsigned_char> *row)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  ArrayPtr<const_unsigned_char> *pAVar2;
  RemoveConst<kj::ArrayPtr<const_unsigned_char>_> *pRVar3;
  size_t sVar4;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,this,(long)(this->rows).builder.pos - (long)(this->rows).builder.ptr >> 4,row,
             0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pAVar1 = (this->rows).builder.endPtr;
    if ((this->rows).builder.pos == pAVar1) {
      pAVar2 = (this->rows).builder.ptr;
      sVar4 = 4;
      if (pAVar1 != pAVar2) {
        sVar4 = (long)pAVar1 - (long)pAVar2 >> 3;
      }
      Vector<kj::ArrayPtr<const_unsigned_char>_>::setCapacity(&this->rows,sVar4);
    }
    pRVar3 = (this->rows).builder.pos;
    sVar4 = row->size_;
    pRVar3->ptr = row->ptr;
    pRVar3->size_ = sVar4;
    pAVar1 = (this->rows).builder.pos;
    (this->rows).builder.pos = pAVar1 + 1;
    return pAVar1;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}